

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

Matrix<double,_3,_1,_0,_3,_1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
_set_noalias<Eigen::IndexedView<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::SingleRange,int_const(&)[3]>>
          (PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *this,
          DenseBase<Eigen::IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::SingleRange,_const_int_(&)[3]>_>
          *other)

{
  assign_op<double,_double> local_9;
  
  internal::
  call_assignment_no_alias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::IndexedView<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::SingleRange,int_const(&)[3]>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this,
             (IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::SingleRange,_const_int_(&)[3]>
              *)other,&local_9);
  return (Matrix<double,_3,_1,_0,_3,_1> *)this;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE Derived& _set_noalias(const DenseBase<OtherDerived>& other)
    {
      // I don't think we need this resize call since the lazyAssign will anyways resize
      // and lazyAssign will be called by the assign selector.
      //_resize_to_match(other);
      // the 'false' below means to enforce lazy evaluation. We don't use lazyAssign() because
      // it wouldn't allow to copy a row-vector into a column-vector.
      internal::call_assignment_no_alias(this->derived(), other.derived(), internal::assign_op<Scalar,typename OtherDerived::Scalar>());
      return this->derived();
    }